

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_pre_write_tile
                   (opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,opj_stream_private_t *p_stream,
                   opj_event_mgr_t *p_manager)

{
  opj_tcd_t *p_tcd;
  OPJ_BOOL OVar1;
  uint uVar2;
  
  if (p_j2k->m_current_tile_number == p_tile_index) {
    opj_event_msg((opj_event_mgr_t *)p_stream,4,"tile number %d / %d\n",(ulong)(p_tile_index + 1),
                  (ulong)((p_j2k->m_cp).th * (p_j2k->m_cp).tw));
    (p_j2k->m_specific_param).m_encoder.m_current_tile_part_number = 0;
    p_tcd = p_j2k->m_tcd;
    p_tcd->cur_totnum_tp = (p_j2k->m_cp).tcps[p_tile_index].m_nb_tile_parts;
    (p_j2k->m_specific_param).m_decoder.m_state = 0;
    OVar1 = opj_tcd_init_encode_tile(p_tcd,p_j2k->m_current_tile_number,(opj_event_mgr_t *)p_stream)
    ;
    uVar2 = (uint)(OVar1 != 0);
  }
  else {
    uVar2 = 0;
    opj_event_msg((opj_event_mgr_t *)p_stream,1,"The given tile index does not match.");
  }
  return uVar2;
}

Assistant:

static OPJ_BOOL opj_j2k_pre_write_tile(opj_j2k_t * p_j2k,
                                       OPJ_UINT32 p_tile_index,
                                       opj_stream_private_t *p_stream,
                                       opj_event_mgr_t * p_manager)
{
    (void)p_stream;
    if (p_tile_index != p_j2k->m_current_tile_number) {
        opj_event_msg(p_manager, EVT_ERROR, "The given tile index does not match.");
        return OPJ_FALSE;
    }

    opj_event_msg(p_manager, EVT_INFO, "tile number %d / %d\n",
                  p_j2k->m_current_tile_number + 1, p_j2k->m_cp.tw * p_j2k->m_cp.th);

    p_j2k->m_specific_param.m_encoder.m_current_tile_part_number = 0;
    p_j2k->m_tcd->cur_totnum_tp = p_j2k->m_cp.tcps[p_tile_index].m_nb_tile_parts;
    p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number = 0;

    /* initialisation before tile encoding  */
    if (! opj_tcd_init_encode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number,
                                   p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}